

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::CommissionerImpl::DecodeChannelMask
                  (Error *__return_storage_ptr__,ChannelMask *aChannelMask,ByteArray *aBuf)

{
  string *this;
  ulong uVar1;
  pointer puVar2;
  pointer pcVar3;
  long lVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  format_args args;
  format_args args_00;
  writer write;
  ChannelMask channelMask;
  ChannelMaskEntry entry;
  undefined8 local_118;
  pointer puStack_110;
  pointer puStack_108;
  undefined8 local_100;
  format_string_checker<char> *local_f8;
  parse_func local_f0 [1];
  Error *local_e8;
  string local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  writer local_b8;
  ErrorCode local_b0 [2];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  local_88;
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  *local_68;
  ByteArray *local_60;
  ulong local_58;
  ChannelMaskEntry local_50;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  local_c0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_c0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_88.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
  uVar9 = 0;
  local_e8 = __return_storage_ptr__;
  local_68 = aChannelMask;
  local_60 = aBuf;
  do {
    if (local_58 <= uVar9) {
      if (uVar9 != local_58) {
        __assert_fail("condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                      ,0x6b9,
                      "static Error ot::commissioner::CommissionerImpl::DecodeChannelMask(ChannelMask &, const ByteArray &)"
                     );
      }
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::operator=(local_68,&local_88);
      goto LAB_0016893f;
    }
    local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar1 = uVar9 + 2;
    if (local_58 < uVar1) {
      local_118 = (pointer)((ulong)local_118._4_4_ << 0x20);
      pcVar7 = "premature end of Channel Mask Entry";
      puStack_110 = "premature end of Channel Mask Entry";
      puStack_108 = (pointer)0x23;
      local_100._0_4_ = 0;
      local_100._4_4_ = 0;
      local_f8 = (format_string_checker<char> *)&local_118;
      local_f0[0] = (parse_func)0x0;
      local_b8.handler_ = local_f8;
      do {
        if (pcVar7 == "") break;
        pcVar8 = pcVar7;
        if (*pcVar7 == '{') {
LAB_0016861c:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_b8,pcVar7,pcVar8);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar8,"",(format_string_checker<char> *)&local_118);
          bVar10 = true;
        }
        else {
          pcVar8 = pcVar7 + 1;
          bVar10 = pcVar8 != "";
          if (bVar10) {
            if (*pcVar8 != '{') {
              pcVar5 = pcVar7 + 2;
              do {
                pcVar8 = pcVar5;
                bVar10 = pcVar8 != "";
                if (pcVar8 == "") goto LAB_00168618;
                pcVar5 = pcVar8 + 1;
              } while (*pcVar8 != '{');
            }
            bVar10 = true;
          }
LAB_00168618:
          if (bVar10) goto LAB_0016861c;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_b8,pcVar7,"");
          bVar10 = false;
        }
      } while (bVar10);
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_118;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e0,(v10 *)"premature end of Channel Mask Entry",(string_view)ZEXT816(0x23),
                 args);
      local_b0[0] = kBadFormat;
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      local_e8->mCode = local_b0[0];
      std::__cxx11::string::operator=((string *)this,(string *)local_a8);
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      iVar6 = 6;
    }
    else {
      puVar2 = (local_60->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      local_50.mPage = puVar2[uVar9];
      lVar4 = uVar9 + 1;
      uVar9 = puVar2[lVar4] + uVar1;
      if (local_58 < uVar9) {
        local_118 = (pointer)((ulong)local_118._4_4_ << 0x20);
        pcVar7 = "premature end of Channel Mask Entry";
        puStack_110 = "premature end of Channel Mask Entry";
        puStack_108 = (pointer)0x23;
        local_100._0_4_ = 0;
        local_100._4_4_ = 0;
        local_f8 = (format_string_checker<char> *)&local_118;
        local_f0[0] = (parse_func)0x0;
        local_b8.handler_ = local_f8;
        do {
          if (pcVar7 == "") break;
          pcVar8 = pcVar7;
          if (*pcVar7 == '{') {
LAB_00168797:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_b8,pcVar7,pcVar8);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar8,"",(format_string_checker<char> *)&local_118);
            bVar10 = true;
          }
          else {
            pcVar8 = pcVar7 + 1;
            bVar10 = pcVar8 != "";
            if (bVar10) {
              if (*pcVar8 != '{') {
                pcVar5 = pcVar7 + 2;
                do {
                  pcVar8 = pcVar5;
                  bVar10 = pcVar8 != "";
                  if (pcVar8 == "") goto LAB_00168793;
                  pcVar5 = pcVar8 + 1;
                } while (*pcVar8 != '{');
              }
              bVar10 = true;
            }
LAB_00168793:
            if (bVar10) goto LAB_00168797;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_b8,pcVar7,"");
            bVar10 = false;
          }
        } while (bVar10);
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_118;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_e0,(v10 *)"premature end of Channel Mask Entry",(string_view)ZEXT816(0x23)
                   ,args_00);
        local_b0[0] = kBadFormat;
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,local_e0._M_dataplus._M_p,
                   local_e0._M_dataplus._M_p + local_e0._M_string_length);
        local_e8->mCode = local_b0[0];
        std::__cxx11::string::operator=((string *)this,(string *)local_a8);
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        iVar6 = 6;
        uVar9 = uVar1;
      }
      else {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_118,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar2 + uVar1),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar2 + uVar1 + puVar2[lVar4]),(allocator_type *)local_b0);
        puVar2 = local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_118;
        local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_110;
        local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puStack_108;
        local_118 = (pointer)0x0;
        puStack_110 = (pointer)0x0;
        puStack_108 = (pointer)0x0;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2);
        }
        if (local_118 != (pointer)0x0) {
          operator_delete(local_118);
        }
        iVar6 = 0;
        std::
        vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
        ::emplace_back<ot::commissioner::ChannelMaskEntry&>
                  ((vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
                    *)&local_88,&local_50);
      }
    }
    if (local_50.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.mMasks.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while (iVar6 == 0);
  if (iVar6 == 6) {
LAB_0016893f:
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_88);
  }
  else {
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_88);
    pcVar3 = (this->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != local_c0) {
      operator_delete(pcVar3);
    }
  }
  return local_e8;
}

Assistant:

Error CommissionerImpl::DecodeChannelMask(ChannelMask &aChannelMask, const ByteArray &aBuf)
{
    Error       error;
    ChannelMask channelMask;
    size_t      offset = 0;
    size_t      length = aBuf.size();

    while (offset < length)
    {
        ChannelMaskEntry entry;
        uint8_t          entryLength;
        VerifyOrExit(offset + 2 <= length, error = ERROR_BAD_FORMAT("premature end of Channel Mask Entry"));

        entry.mPage = aBuf[offset++];
        entryLength = aBuf[offset++];

        VerifyOrExit(offset + entryLength <= length, error = ERROR_BAD_FORMAT("premature end of Channel Mask Entry"));
        entry.mMasks = {aBuf.begin() + offset, aBuf.begin() + offset + entryLength};
        channelMask.emplace_back(entry);

        offset += entryLength;
    }

    ASSERT(offset == length);

    aChannelMask = channelMask;

exit:
    return error;
}